

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

insert_return_type * __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
::insert(insert_return_type *__return_storage_ptr__,
        raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
        *this,node_type *node,size_t hashval)

{
  bool bVar1;
  slot_type *slot;
  pair<const_int,_int> *ts;
  iterator iVar2;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *local_60;
  slot_type *local_58;
  pair<const_int,_int> **local_50;
  undefined1 local_48 [8];
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
  res;
  pair<const_int,_int> *elem;
  size_t hashval_local;
  node_type *node_local;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_local;
  
  elem = (pair<const_int,_int> *)hashval;
  hashval_local = (size_t)node;
  node_local = (node_type *)this;
  this_local = (raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
                *)__return_storage_ptr__;
  bVar1 = node_handle_base::operator_cast_to_bool((node_handle_base *)node);
  if (bVar1) {
    slot = CommonAccess::
           GetSlot<phmap::priv::node_handle<phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,int>,void>,std::allocator<std::pair<int_const,int>>,void>>
                     ((node_handle<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>,_void>
                       *)hashval_local);
    ts = hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,int>,void>::
         element<phmap::priv::FlatHashMapPolicy<int,int>>(slot);
    local_60 = this;
    res._16_8_ = ts;
    local_58 = CommonAccess::
               GetSlot<phmap::priv::node_handle<phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,int>,void>,std::allocator<std::pair<int_const,int>>,void>>
                         ((node_handle<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>,_void>
                           *)hashval_local);
    local_50 = &elem;
    hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,int>,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>::InsertSlotWithHash<false>,std::pair<int_const,int>const&,phmap::priv::FlatHashMapPolicy<int,int>>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                *)local_48,
               (hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,int>,void> *)&local_60,
               (InsertSlotWithHash<false> *)res._16_8_,ts);
    if ((res.first.field_1._0_1_ & 1) == 0) {
      (__return_storage_ptr__->position).ctrl_ = (ctrl_t *)local_48;
      (__return_storage_ptr__->position).field_1.slot_ = (slot_type *)res.first.ctrl_;
      __return_storage_ptr__->inserted = false;
      node_handle<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>,_void>
      ::node_handle(&__return_storage_ptr__->node,
                    (node_handle<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>,_void>
                     *)hashval_local);
    }
    else {
      CommonAccess::
      Reset<phmap::priv::node_handle<phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,int>,void>,std::allocator<std::pair<int_const,int>>,void>>
                ((node_handle<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>,_void>
                  *)hashval_local);
      (__return_storage_ptr__->position).ctrl_ = (ctrl_t *)local_48;
      (__return_storage_ptr__->position).field_1.slot_ = (slot_type *)res.first.ctrl_;
      __return_storage_ptr__->inserted = true;
      node_handle<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>,_void>
      ::node_handle(&__return_storage_ptr__->node);
    }
  }
  else {
    iVar2 = end(this);
    __return_storage_ptr__->position = iVar2;
    __return_storage_ptr__->inserted = false;
    node_handle<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>,_void>
    ::node_handle(&__return_storage_ptr__->node);
  }
  return __return_storage_ptr__;
}

Assistant:

insert_return_type insert(node_type&& node, size_t hashval) {
        if (!node) return {end(), false, node_type()};
        const auto& elem = PolicyTraits::element(CommonAccess::GetSlot(node));
        auto res = PolicyTraits::apply(
            InsertSlotWithHash<false>{*this, std::move(*CommonAccess::GetSlot(node)), hashval},
            elem);
        if (res.second) {
            CommonAccess::Reset(&node);
            return {res.first, true, node_type()};
        } else {
            return {res.first, false, std::move(node)};
        }
    }